

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

bool __thiscall
Js::Phases::IsEnabled(Phases *this,Phase phase,uint sourceContextId,LocalFunctionId functionId)

{
  SListBase<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator,RealCount> *this_00;
  bool bVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  anon_class_8_1_54a3980e fn;
  
  uVar2 = (ulong)(uint)((int)CONCAT62(in_register_00000032,phase) << 5);
  if ((&this->phaseList[0].valid)[uVar2] == true) {
    this_00 = (SListBase<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator,RealCount>
               *)((long)&this->phaseList[0].range.super_RangeBase<Js::SourceFunctionNode>.range.
                         super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                         .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next + uVar2);
    if (*(SListBase<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator,RealCount> **
         )((long)&this->phaseList[0].range.super_RangeBase<Js::SourceFunctionNode>.range.
                  super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                  .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next + uVar2) != this_00) {
      fn.n.functionId = functionId;
      fn.n.sourceContextId = sourceContextId;
      bVar1 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator,RealCount>
              ::
              MapUntil<Js::RangeBase<Js::SourceFunctionNode>::InRange(Js::SourceFunctionNode)::_lambda(Js::RangeUnit<Js::SourceFunctionNode>const&)_1_>
                        (this_00,fn);
      return bVar1;
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
    Phases::IsEnabled(Phase phase, uint sourceContextId, Js::LocalFunctionId functionId)
    {
        return  this->phaseList[(int)phase].valid &&
                this->phaseList[(int)phase].range.InRange(SourceFunctionNode(sourceContextId, functionId));
    }